

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock-spec-builders.h
# Opt level: O0

ActionResultHolder<unsigned_short> *
testing::internal::ActionResultHolder<unsigned_short>::PerformAction<unsigned_short(unsigned_short)>
          (Action<unsigned_short_(unsigned_short)> *action,type args)

{
  type this;
  Result value;
  ActionResultHolder<unsigned_short> *this_00;
  tuple<unsigned_short> local_1c;
  Wrapper local_1a;
  tuple<unsigned_short> *local_18;
  type args_local;
  Action<unsigned_short_(unsigned_short)> *action_local;
  
  local_18 = args;
  args_local = (type)action;
  this_00 = (ActionResultHolder<unsigned_short> *)operator_new(0x10);
  this = args_local;
  std::tuple<unsigned_short>::tuple(&local_1c,local_18);
  value = Action<unsigned_short_(unsigned_short)>::Perform
                    ((Action<unsigned_short_(unsigned_short)> *)this,&local_1c);
  ReferenceOrValueWrapper<unsigned_short>::ReferenceOrValueWrapper(&local_1a,value);
  ActionResultHolder(this_00,local_1a);
  return this_00;
}

Assistant:

static ActionResultHolder* PerformAction(
      const Action<F>& action,
      typename RvalueRef<typename Function<F>::ArgumentTuple>::type args) {
    return new ActionResultHolder(
        Wrapper(action.Perform(internal::move(args))));
  }